

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O0

int map_clear(map m)

{
  long lVar1;
  size_t sVar2;
  bucket pbVar3;
  undefined8 *in_RDI;
  bucket b;
  size_t iterator;
  ulong in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    if (in_RDI[3] != 0) {
      for (in_stack_ffffffffffffffe8 = 0; in_stack_ffffffffffffffe8 < (ulong)in_RDI[1];
          in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1) {
        lVar1 = in_RDI[3] + in_stack_ffffffffffffffe8 * 0x18;
        if (*(long *)(lVar1 + 0x10) != 0) {
          free(*(void **)(lVar1 + 0x10));
        }
      }
      free((void *)in_RDI[3]);
    }
    *in_RDI = 0;
    in_RDI[2] = 0;
    sVar2 = bucket_capacity(in_RDI[2]);
    in_RDI[1] = sVar2;
    pbVar3 = bucket_create(in_stack_ffffffffffffffe8);
    in_RDI[3] = pbVar3;
    if (in_RDI[3] == 0) {
      log_write_impl_va("metacall",0x1d1,"map_clear",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Bad map clear bucket creation");
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int map_clear(map m)
{
	if (m == NULL)
	{
		return 1;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map clear bucket creation");
		return 1;
	}

	return 0;
}